

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.cpp
# Opt level: O0

void __thiscall ncnn::Option::Option(Option *this)

{
  int iVar1;
  undefined1 *in_RDI;
  
  *in_RDI = 1;
  iVar1 = get_cpu_count();
  *(int *)(in_RDI + 4) = iVar1;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  in_RDI[0x18] = 1;
  in_RDI[0x19] = 1;
  in_RDI[0x1a] = 1;
  in_RDI[0x1b] = 0;
  in_RDI[0x1c] = 1;
  in_RDI[0x1d] = 1;
  in_RDI[0x1e] = 0;
  in_RDI[0x1f] = 1;
  in_RDI[0x20] = 0;
  in_RDI[0x21] = 0;
  if (*(int *)(in_RDI + 4) < 1) {
    *(undefined4 *)(in_RDI + 4) = 1;
  }
  return;
}

Assistant:

Option::Option()
{
    lightmode = true;
    num_threads = get_cpu_count();
    blob_allocator = 0;
    workspace_allocator = 0;

#if NCNN_VULKAN
    blob_vkallocator = 0;
    workspace_vkallocator = 0;
    staging_vkallocator = 0;
#endif // NCNN_VULKAN

    use_winograd_convolution = true;
    use_sgemm_convolution = true;
    use_int8_inference = true;
    use_vulkan_compute = false;// TODO enable me

    use_fp16_packed = true;
    use_fp16_storage = true;
    use_fp16_arithmetic = false;
    use_int8_storage = true;
    use_int8_arithmetic = false;

    use_packing_layout = false;

    // sanitize
    if (num_threads <= 0)
        num_threads = 1;
}